

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDD.cpp
# Opt level: O0

void __thiscall HDD::SetIdentifyData(HDD *this,IDENTIFYDEVICE *pIdentify_)

{
  long local_160;
  int64_t local_158;
  int64_t local_150;
  string local_128;
  string local_108;
  string local_e8;
  long local_c8;
  longlong llTotalSectorsLBA48;
  longlong llMaxSectorsLBA48;
  int64_t llTotalSectors;
  int64_t uTotalSectorsLBA28;
  int64_t iStack_a0;
  int uMaxSectorsLBA28;
  int64_t uTotalSectorsCHS;
  int uMaxSectorsCHS;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  string strDate;
  IDENTIFYDEVICE *pIdentify__local;
  HDD *this_local;
  
  strDate.field_2._8_8_ = pIdentify_;
  if (pIdentify_ == (IDENTIFYDEVICE *)0x0) {
    CalculateGeometry(this->total_sectors,&this->cyls,&this->heads,&this->sectors);
    memset(&this->sIdentify,0,0x204);
    (this->sIdentify).len = 0x200;
    (this->sIdentify).field_1.word[0] = 0x40;
    (this->sIdentify).field_1.word[1] = (uint16_t)this->cyls;
    (this->sIdentify).field_1.word[3] = (uint16_t)this->heads;
    (this->sIdentify).field_1.word[6] = (uint16_t)this->sectors;
    util::fmt_abi_cxx11_((string *)local_38,"%04u%02u%02u",0x7e9,4,0x19);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_59);
    SetIdentifyString(this,&local_58,(void *)((long)&(this->sIdentify).field_1 + 0x14),0x14);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    SetIdentifyString(this,(string *)local_38,(void *)((long)&(this->sIdentify).field_1 + 0x2e),8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&uMaxSectorsCHS,"SAMdisk Device",
               (allocator<char> *)((long)&uTotalSectorsCHS + 7));
    SetIdentifyString(this,(string *)&uMaxSectorsCHS,
                      (void *)((long)&(this->sIdentify).field_1 + 0x36),0x28);
    std::__cxx11::string::~string((string *)&uMaxSectorsCHS);
    std::allocator<char>::~allocator((allocator<char> *)((long)&uTotalSectorsCHS + 7));
    (this->sIdentify).field_1.word[0x2f] = 1;
    (this->sIdentify).field_1.word[0x31] = 0x200;
    (this->sIdentify).field_1.word[0x35] = 1;
    (this->sIdentify).field_1.word[0x36] = (this->sIdentify).field_1.word[1];
    (this->sIdentify).field_1.word[0x37] = (this->sIdentify).field_1.word[3];
    (this->sIdentify).field_1.word[0x38] = (this->sIdentify).field_1.word[6];
    uTotalSectorsCHS._0_4_ = 0xfbfc10;
    if (this->total_sectors < 0xfbfc11) {
      local_150 = this->total_sectors;
    }
    else {
      local_150 = 0xfbfc10;
    }
    iStack_a0 = local_150;
    (this->sIdentify).field_1.word[0x39] = (uint16_t)local_150;
    (this->sIdentify).field_1.word[0x3a] = (uint16_t)((ulong)local_150 >> 0x10);
    uTotalSectorsLBA28._4_4_ = 0xfffffff;
    if (this->total_sectors < 0x10000000) {
      local_158 = this->total_sectors;
    }
    else {
      local_158 = 0xfffffff;
    }
    llTotalSectors = local_158;
    (this->sIdentify).field_1.word[0x3c] = (uint16_t)local_158;
    (this->sIdentify).field_1.word[0x3d] = (uint16_t)((ulong)local_158 >> 0x10);
    llMaxSectorsLBA48 = this->total_bytes / (long)this->sector_size;
    llTotalSectorsLBA48 = 0xffffffffffff;
    local_160 = llMaxSectorsLBA48;
    if (0xffffffffffff < llMaxSectorsLBA48) {
      local_160 = 0xffffffffffff;
    }
    local_c8 = local_160;
    (this->sIdentify).field_1.word[100] = (uint16_t)local_160;
    (this->sIdentify).field_1.word[0x65] = (uint16_t)((ulong)local_160 >> 0x10);
    (this->sIdentify).field_1.word[0x66] = (uint16_t)((ulong)local_160 >> 0x20);
    (this->sIdentify).field_1.word[0x67] = 0;
    if (opt.nocfa == 0) {
      (this->sIdentify).field_1.word[0] = 0x848a;
      (this->sIdentify).field_1.word[0x53] = (this->sIdentify).field_1.word[0x53] | 0x4004;
      (this->sIdentify).field_1.word[0x54] = (this->sIdentify).field_1.word[0x54] | 0x4000;
      (this->sIdentify).field_1.word[0x56] = (this->sIdentify).field_1.word[0x56] | 4;
      (this->sIdentify).field_1.word[0x57] = (this->sIdentify).field_1.word[0x57] | 0x4000;
    }
    std::__cxx11::string::~string((string *)local_38);
  }
  else {
    memcpy(&this->sIdentify,pIdentify_,0x204);
    this->cyls = (uint)(this->sIdentify).field_1.word[1];
    this->heads = (uint)(this->sIdentify).field_1.word[3];
    this->sectors = (uint)(this->sIdentify).field_1.word[6];
    if (opt.noidentify != 0) {
      (this->sIdentify).len = 0;
    }
  }
  GetIdentifyString_abi_cxx11_
            (&local_e8,this,(void *)((long)&(this->sIdentify).field_1 + 0x14),0x14);
  std::__cxx11::string::operator=((string *)&this->strSerialNumber,(string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  GetIdentifyString_abi_cxx11_(&local_108,this,(void *)((long)&(this->sIdentify).field_1 + 0x2e),8);
  std::__cxx11::string::operator=((string *)&this->strFirmwareRevision,(string *)&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  GetIdentifyString_abi_cxx11_
            (&local_128,this,(void *)((long)&(this->sIdentify).field_1 + 0x36),0x28);
  std::__cxx11::string::operator=((string *)&this->strMakeModel,(string *)&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  return;
}

Assistant:

void HDD::SetIdentifyData(const IDENTIFYDEVICE* pIdentify_)
{
    // Use any supplied identify data
    if (pIdentify_)
    {
        // Copy the supplied data
        memcpy(&sIdentify, pIdentify_, sizeof(sIdentify));

        // Update CHS from the identify data
        cyls = sIdentify.word[1];
        heads = sIdentify.word[3];
        sectors = sIdentify.word[6];

        // Invalidate the identify length if we're told to ignore it
        if (opt.noidentify)
            sIdentify.len = 0;
    }
    else
    {
        // Generate CHS values from the total sector count
        CalculateGeometry(total_sectors, cyls, heads, sectors);

        // Clear any existing data and set the full data size
        memset(&sIdentify, 0, sizeof(sIdentify));
        sIdentify.len = sizeof(sIdentify.byte);

        sIdentify.word[0] = (1 << 6);     // fixed device

        // CHS values
        sIdentify.word[1] = static_cast<uint16_t>(cyls);
        sIdentify.word[3] = static_cast<uint16_t>(heads);
        sIdentify.word[6] = static_cast<uint16_t>(sectors);

        // Form 8-character date string from SAMdisk build date, to use as firmware revision
        std::string strDate = util::fmt("%04u%02u%02u", YEAR, MONTH + 1, DAY);

        // Serial number, firmware revision and model number
        SetIdentifyString("", &sIdentify.word[10], 20);
        SetIdentifyString(strDate, &sIdentify.word[23], 8);
        SetIdentifyString("SAMdisk Device", &sIdentify.word[27], 40);

        sIdentify.word[47] = 1;                     // read/write multiple supports 1 sector blocks
        sIdentify.word[49] = (1 << 9);              // LBA supported

        // Current override CHS values
        sIdentify.word[53] = (1 << 0);              // words 54-58 are valid
        sIdentify.word[54] = sIdentify.word[1];     // current cyls
        sIdentify.word[55] = sIdentify.word[3];     // current heads
        sIdentify.word[56] = sIdentify.word[6];     // current sectors

        // Max CHS sector count is just C*H*S with maximum values for each
        auto uMaxSectorsCHS = 16383 * 16 * 63;
        auto uTotalSectorsCHS = (total_sectors > uMaxSectorsCHS) ? uMaxSectorsCHS : total_sectors;
        sIdentify.word[57] = static_cast<uint16_t>(uTotalSectorsCHS & 0xffff);
        sIdentify.word[58] = static_cast<uint16_t>((uTotalSectorsCHS >> 16) & 0xffff);

        // Max LBA28 sector count is 0x0fffffff
        auto uMaxSectorsLBA28 = (1 << 28) - 1;
        auto uTotalSectorsLBA28 = (total_sectors > uMaxSectorsLBA28) ? uMaxSectorsLBA28 : total_sectors;
        sIdentify.word[60] = uTotalSectorsLBA28 & 0xffff;
        sIdentify.word[61] = (uTotalSectorsLBA28 >> 16) & 0xffff;

        // Max LBA48 sector count is 0x0000ffffffffffff
        auto llTotalSectors = total_bytes / sector_size;
        auto llMaxSectorsLBA48 = (1LL << 48) - 1;
        auto llTotalSectorsLBA48 = (llTotalSectors > llMaxSectorsLBA48) ? llMaxSectorsLBA48 : llTotalSectors;
        sIdentify.word[100] = static_cast<uint16_t>(llTotalSectorsLBA48 & 0xffff);
        sIdentify.word[101] = static_cast<uint16_t>((llTotalSectorsLBA48 >> 16) & 0xffff);
        sIdentify.word[102] = static_cast<uint16_t>((llTotalSectorsLBA48 >> 32) & 0xffff);
        sIdentify.word[103] = 0;

        // If CFA ((CompactFlash Association) support isn't explicitly disabled, enable it
        if (!opt.nocfa)
        {
            sIdentify.word[0] = 0x848a;     // special value used to indicate CFA feature set support

            sIdentify.word[83] |= (1 << 2) | (1 << 14); // CFA feature set supported, feature bits are valid
            sIdentify.word[84] |= (1 << 14);            // indicate feature bits are valid
            sIdentify.word[86] |= (1 << 2);         // CFA feature set enabled
            sIdentify.word[87] |= (1 << 14);            // indicate features enabled are valid
        }
    }

    // Read the strings for serial number, firmware revision and make/model
    strSerialNumber = GetIdentifyString(&sIdentify.word[10], 20);
    strFirmwareRevision = GetIdentifyString(&sIdentify.word[23], 8);
    strMakeModel = GetIdentifyString(&sIdentify.word[27], 40);
}